

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PromiseClient::~PromiseClient(PromiseClient *this)

{
  ~PromiseClient((PromiseClient *)&this[-1].fork.hub.ptr);
  return;
}

Assistant:

KJ_IF_SOME(id, importId) {
        // This object is representing an import promise.  That means the import table may still
        // contain a pointer back to it.  Remove that pointer.  Note that we have to verify that
        // the import still exists and the pointer still points back to this object because this
        // object may actually outlive the import.
        KJ_IF_SOME(import, connectionState->imports.find(id)) {
          KJ_IF_SOME(c, import.appClient) {
            if (&c == this) {
              import.appClient = kj::none;
            }
          }
        }
      }